

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::complete_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,deliver_op_tracer *tracer,type_index *msg_type,message_ref_t *message,
          invocation_type_t demand_type)

{
  size_t sVar1;
  intrusive_ptr_t<so_5::message_t> local_48;
  demand_t local_40;
  
  sVar1 = (this->m_queue).m_size;
  local_40.m_msg_type = (type_index)msg_type->_M_target;
  local_40.m_message_ref = (message_ref_t)message->m_obj;
  if (local_40.m_message_ref.m_obj == (message_t *)0x0) {
    local_40.m_message_ref.m_obj = (message_t *)0x0;
  }
  else {
    LOCK();
    ((local_40.m_message_ref.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_40.m_message_ref.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_48.m_obj = (message_t *)0x0;
  local_40.m_demand_type = demand_type;
  details::limited_preallocated_demand_queue::push_back(&this->m_queue,&local_40);
  intrusive_ptr_t<so_5::message_t>::dismiss_object(&local_40.m_message_ref);
  intrusive_ptr_t<so_5::message_t>::dismiss_object(&local_48);
  impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
  stored<so_5::mchain_props::details::limited_preallocated_demand_queue>(tracer,&this->m_queue);
  if (sVar1 == 0) {
    if ((this->m_not_empty_notificator).super__Function_base._M_manager != (_Manager_type)0x0) {
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::complete_store_message_to_queue(so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                ((anon_class_8_1_8991fb9c)this);
    }
    notify_multi_chain_select_ops(this);
  }
  if ((this->m_threads_to_wakeup != 0) && ((this->m_queue).m_size <= this->m_threads_to_wakeup)) {
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void
		complete_store_message_to_queue(
			typename TRACING_BASE::deliver_op_tracer & tracer,
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				const bool was_empty = m_queue.is_empty();
				
				m_queue.push_back(
						demand_t{ msg_type, message, demand_type } );

				tracer.stored( m_queue );

				// If chain was empty then multi-chain cases must be notified.
				// And if not_empty_notificator is defined then it must be used too.
				if( was_empty )
					{
						if( m_not_empty_notificator )
							so_5::details::invoke_noexcept_code(
								[this] { m_not_empty_notificator(); } );

						notify_multi_chain_select_ops();
					}

				// Should be wake up some sleeping thread?
				if( m_threads_to_wakeup && m_threads_to_wakeup >= m_queue.size() )
					// Someone is waiting on empty queue.
					m_underflow_cond.notify_one();
			}